

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O2

int main(int param_1,char **argv)

{
  long lVar1;
  ostream *poVar2;
  string prog;
  allocator<char> local_29;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,*argv,&local_29);
  lVar1 = std::__cxx11::string::find((char *)local_28,0x104129);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)local_28,0x104136);
    if (lVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Don\'t know what to do as ");
      poVar2 = std::operator<<(poVar2,local_28);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      clock_out();
    }
  }
  else {
    clock_in();
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int main( int, const char *argv[] )
{
  std::string prog(argv[0]);
  if (prog.find("midiclock_in") != prog.npos) {
    clock_in();
  }
  else if (prog.find("midiclock_out") != prog.npos) {
    clock_out();
  }
  else {
    std::cout << "Don't know what to do as " << prog << std::endl;
  }
  return 0;
}